

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master.hpp
# Opt level: O0

void __thiscall
diy::Master::foreach<diy::detail::ReductionFunctor<Block,diy::detail::KDTreePartners>>
          (Master *this,ReductionFunctor<Block,_diy::detail::KDTreePartners> *f,Skip *s)

{
  Skip *in_stack_00000070;
  Callback<Block> *in_stack_00000078;
  Master *in_stack_00000080;
  ReductionFunctor<Block,_diy::detail::KDTreePartners> *in_stack_ffffffffffffffb8;
  function<void_(Block_*,_const_diy::Master::ProxyWithLink_&)> *in_stack_ffffffffffffffc0;
  
  std::function<void(Block*,diy::Master::ProxyWithLink_const&)>::
  function<diy::detail::ReductionFunctor<Block,diy::detail::KDTreePartners>const&,void>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  foreach_<Block>(in_stack_00000080,in_stack_00000078,in_stack_00000070);
  std::function<void_(Block_*,_const_diy::Master::ProxyWithLink_&)>::~function
            ((function<void_(Block_*,_const_diy::Master::ProxyWithLink_&)> *)0x1a7e7f);
  return;
}

Assistant:

void          foreach(const F& f, const Skip& s = NeverSkip())
      {
          using Block = typename detail::block_traits<F>::type;
          foreach_<Block>(f, s);
      }